

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

UnitsPtr __thiscall
libcellml::modelsEquivalentUnits(libcellml *this,ModelPtr *model,UnitsPtr *units)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  UnitsPtr UVar5;
  undefined8 local_28;
  size_t i;
  UnitsPtr *units_local;
  ModelPtr *model_local;
  UnitsPtr *u;
  
  local_28 = 0;
  while( true ) {
    peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    sVar3 = Model::unitsCount(peVar2);
    if (sVar3 <= local_28) break;
    peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
    Model::units((Model *)this,(size_t)peVar2);
    bVar1 = Units::equivalent((UnitsPtr *)this,units);
    _Var4._M_pi = extraout_RDX;
    if (bVar1) goto LAB_0031219d;
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)this);
    local_28 = local_28 + 1;
  }
  std::shared_ptr<libcellml::Units>::shared_ptr((shared_ptr<libcellml::Units> *)this,(nullptr_t)0x0)
  ;
  _Var4._M_pi = extraout_RDX_00;
LAB_0031219d:
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr modelsEquivalentUnits(const ModelPtr &model, const UnitsPtr &units)
{
    for (size_t i = 0; i < model->unitsCount(); ++i) {
        const UnitsPtr u = model->units(i);
        if (Units::equivalent(u, units)) {
            return u;
        }
    }

    return nullptr;
}